

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Find<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Find<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  pointer ppVar1;
  pointer ppVar2;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertHelper local_560;
  AssertionResult gtest_ar_;
  vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  values;
  AssertHelper local_520;
  iterator local_518;
  iterator it;
  TypeParam m;
  
  values.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,void>>
            (&values,10);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
  ::array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
           *)&m);
  ppVar1 = values.
           super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = values.
                super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::find<phmap::priv::hash_internal::EnumClass>
              (&it,(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                    *)&m,&ppVar2->first);
    if (it.inner_ == (Inner *)0x0) {
      gtest_ar_.success_ = true;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
    }
    else {
      gtest_ar_.success_ = false;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::PrintToString<phmap::priv::hash_internal::EnumClass>((string *)&it,&ppVar2->first);
      std::operator<<((ostream *)(CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 0x10),
                      (string *)&it);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&local_518,(internal *)&gtest_ar_,
                 (AssertionResult *)"m.end() == m.find(p.first)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_560,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x58,(char *)local_518.inner_);
      testing::internal::AssertHelper::operator=(&local_560,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_560);
      std::__cxx11::string::~string((string *)&local_518);
      std::__cxx11::string::~string((string *)&it);
      if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>*,std::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&m,(__normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
                    )values.
                     super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
              )values.
               super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  ppVar1 = values.
           super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = values.
                super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::find<phmap::priv::hash_internal::EnumClass>
              (&it,(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                    *)&m,&ppVar2->first);
    local_518.it_end_.ctrl_ = (ctrl_t *)0x0;
    local_518.inner_ = (Inner *)0x0;
    local_518.inner_end_ = (Inner *)0x0;
    local_518.it_.ctrl_ = (ctrl_t *)0x0;
    gtest_ar__1.success_ = operator!=(&local_518,&it);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_560);
      testing::PrintToString<phmap::priv::hash_internal::EnumClass>
                ((string *)&local_518,&ppVar2->first);
      std::operator<<((ostream *)&(local_560.data_)->line,(string *)&local_518);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"m.end() != it",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_520,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x5d,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
      testing::internal::AssertHelper::operator=(&local_520,(Message *)&local_560);
      testing::internal::AssertHelper::~AssertHelper(&local_520);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      std::__cxx11::string::~string((string *)&local_518);
      if (local_560.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_560.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_,"p.second","get<1>(*it)",&ppVar2->second,
               &(*it.it_.field_1.slot_)->second);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::PrintToString<phmap::priv::hash_internal::EnumClass>
                ((string *)&local_518,&ppVar2->first);
      std::operator<<((ostream *)(CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 0x10),
                      (string *)&local_518);
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_560,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x5e,message);
      testing::internal::AssertHelper::operator=(&local_560,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper(&local_560);
      std::__cxx11::string::~string((string *)&local_518);
      if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
  ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>::Inner,_16UL>
            *)&m);
  std::
  _Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~_Vector_base(&values.
                   super__Vector_base<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
                 );
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}